

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O0

Histogram *
Omega_h::get_histogram
          (Histogram *__return_storage_ptr__,Mesh *mesh,Int dim,Int nbins,Real min_value,
          Real max_value,Reals *values)

{
  LO LVar1;
  promoted_t<signed_char> pVar2;
  reference pvVar3;
  double dVar4;
  Read<signed_char> local_180;
  undefined1 local_170 [48];
  undefined1 local_140 [8];
  Bytes marked;
  Read<signed_char> local_120;
  Read<double> local_110;
  Read<signed_char> local_100;
  undefined1 local_f0 [8];
  Read<signed_char> ceil_marks;
  undefined1 local_d0 [8];
  Bytes floor_marks;
  Real ceil;
  Real floor;
  Int i;
  Real interval;
  Read<double> local_90;
  undefined1 local_80 [8];
  Read<double> owned_values;
  Reals *values_local;
  Real max_value_local;
  Real min_value_local;
  Int nbins_local;
  Int dim_local;
  Mesh *mesh_local;
  Histogram *histogram;
  element_type *local_10;
  
  if (((ulong)(values->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (element_type *)((values->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (element_type *)((ulong)(values->write_).shared_alloc_.alloc >> 3);
  }
  owned_values.write_.shared_alloc_.direct_ptr = values;
  LVar1 = Mesh::nents(mesh,dim);
  if ((int)((ulong)local_10 >> 3) != LVar1) {
    fail("assertion %s failed at %s +%d\n","values.size() == mesh->nents(dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_histogram.cpp"
         ,0x11);
  }
  Read<double>::Read(&local_90,values);
  Mesh::owned_array<double>
            ((Mesh *)local_80,(Int)mesh,(Read<double> *)(ulong)(uint)dim,(Int)&local_90);
  Read<double>::~Read(&local_90);
  dVar4 = (max_value - min_value) / (double)nbins;
  Histogram::Histogram(__return_storage_ptr__);
  __return_storage_ptr__->min = min_value;
  __return_storage_ptr__->max = max_value;
  std::vector<long,_std::allocator<long>_>::resize(&__return_storage_ptr__->bins,(long)nbins);
  for (floor._0_4_ = 0; floor._0_4_ < nbins; floor._0_4_ = floor._0_4_ + 1) {
    floor_marks.write_.shared_alloc_.direct_ptr =
         (void *)(dVar4 * (double)(floor._0_4_ + 1) + min_value);
    if (floor._0_4_ == nbins + -1) {
      floor_marks.write_.shared_alloc_.direct_ptr = (void *)max_value;
    }
    Read<double>::Read((Read<double> *)&ceil_marks.write_.shared_alloc_.direct_ptr,
                       (Read<double> *)local_80);
    each_geq_to<double>((Omega_h *)local_d0,
                        (Read<double> *)&ceil_marks.write_.shared_alloc_.direct_ptr,
                        dVar4 * (double)floor._0_4_ + min_value);
    Read<double>::~Read((Read<double> *)&ceil_marks.write_.shared_alloc_.direct_ptr);
    local_f0 = (undefined1  [8])0x0;
    ceil_marks.write_.shared_alloc_.alloc = (Alloc *)0x0;
    if (floor._0_4_ == nbins + -1) {
      Read<double>::Read(&local_110,(Read<double> *)local_80);
      each_leq_to<double>((Omega_h *)&local_100,&local_110,
                          (double)floor_marks.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::operator=((Read<signed_char> *)local_f0,&local_100);
      Read<signed_char>::~Read(&local_100);
      Read<double>::~Read(&local_110);
    }
    else {
      Read<double>::Read((Read<double> *)&marked.write_.shared_alloc_.direct_ptr,
                         (Read<double> *)local_80);
      each_lt<double>((Omega_h *)&local_120,(Read<double> *)&marked.write_.shared_alloc_.direct_ptr,
                      (double)floor_marks.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::operator=((Read<signed_char> *)local_f0,&local_120);
      Read<signed_char>::~Read(&local_120);
      Read<double>::~Read((Read<double> *)&marked.write_.shared_alloc_.direct_ptr);
    }
    Read<signed_char>::Read((Read<signed_char> *)(local_170 + 0x20),(Read<signed_char> *)local_d0);
    Read<signed_char>::Read((Read<signed_char> *)(local_170 + 0x10),(Read<signed_char> *)local_f0);
    land_each((Omega_h *)local_140,(Bytes *)(local_170 + 0x20),(Bytes *)(local_170 + 0x10));
    Read<signed_char>::~Read((Read<signed_char> *)(local_170 + 0x10));
    Read<signed_char>::~Read((Read<signed_char> *)(local_170 + 0x20));
    Mesh::comm((Mesh *)local_170);
    Read<signed_char>::Read(&local_180,(Read<signed_char> *)local_140);
    pVar2 = get_sum<signed_char>((CommPtr *)local_170,&local_180);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       (&__return_storage_ptr__->bins,(long)floor._0_4_);
    *pvVar3 = (long)pVar2;
    Read<signed_char>::~Read(&local_180);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_170);
    Read<signed_char>::~Read((Read<signed_char> *)local_140);
    Read<signed_char>::~Read((Read<signed_char> *)local_f0);
    Read<signed_char>::~Read((Read<signed_char> *)local_d0);
  }
  Read<double>::~Read((Read<double> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Histogram get_histogram(Mesh* mesh, Int dim, Int nbins, Real min_value,
    Real max_value, Reals values) {
  OMEGA_H_CHECK(values.size() == mesh->nents(dim));
  auto owned_values = mesh->owned_array(dim, values, 1);
  auto interval = (max_value - min_value) / Real(nbins);
  Histogram histogram;
  histogram.min = min_value;
  histogram.max = max_value;
  histogram.bins.resize(std::size_t(nbins));
  for (Int i = 0; i < nbins; ++i) {
    auto floor = interval * i + min_value;
    auto ceil = interval * (i + 1) + min_value;
    if (i == nbins - 1) ceil = max_value;
    auto floor_marks = each_geq_to(owned_values, floor);
    Read<I8> ceil_marks;
    if (i == nbins - 1)
      ceil_marks = each_leq_to(owned_values, ceil);
    else
      ceil_marks = each_lt(owned_values, ceil);
    auto marked = land_each(floor_marks, ceil_marks);
    histogram.bins[std::size_t(i)] = get_sum(mesh->comm(), marked);
  }
  return histogram;
}